

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

void __thiscall
lossless_neural_sound::expression_compiler::expression::Product::write_expression
          (Product *this,ostream *os,Expression_writing_state *state)

{
  Precedence PVar1;
  anon_class_24_3_f6ef14e5 fn;
  char *separator;
  char *local_28;
  
  PVar1 = state->current_precedence;
  state->current_precedence = Times;
  if (1 < (int)PVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  }
  local_28 = "";
  fn.separator = &local_28;
  fn.os = os;
  fn.state = state;
  Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
  visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::write_expression(std::ostream&,lossless_neural_sound::expression_compiler::expression::Expression_node::Expression_writing_state&)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
            (&this->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>,
             fn);
  if (1 < (int)PVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  state->current_precedence = PVar1;
  return;
}

Assistant:

virtual void write_expression(std::ostream &os, Expression_writing_state &state) const override
    {
        Expression_writing_state::Parenthesis_writer pw(
            state, os, Expression_writing_state::Precedence::Times);
        auto separator = "";
        visit_leaves([&](const Expression_node *factor)
                     {
                         os << separator;
                         separator = " * ";
                         factor->write_expression(os, state);
                     });
    }